

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

uhugeint_t __thiscall
duckdb::NegateOperator::Operation<duckdb::uhugeint_t,duckdb::uhugeint_t>
          (NegateOperator *this,uhugeint_t input)

{
  uhugeint_t uVar1;
  uhugeint_t local_10;
  
  local_10.upper = input.lower;
  local_10.lower = (uint64_t)this;
  uVar1 = uhugeint_t::operator-(&local_10);
  return uVar1;
}

Assistant:

static inline TR Operation(TA input) {
		auto cast = (TR)input;
		if (!CanNegate<TR>(cast)) {
			throw OutOfRangeException("Overflow in negation of integer!");
		}
		return -cast;
	}